

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

vector<int,_std::allocator<int>_> *
ipx::Sortperm(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Int m,double *values,
             bool reverse)

{
  pointer piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  allocator_type local_31;
  double *local_30;
  
  local_30 = values;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(long)m,&local_31);
  auVar2 = _DAT_003beea0;
  if (0 < m) {
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (ulong)(uint)m - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_003beea0;
    auVar7 = _DAT_003bee90;
    do {
      auVar8 = auVar7 ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        piVar1[uVar5] = (int)uVar5;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        piVar1[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar4 + 2;
    } while ((m + 1U & 0xfffffffe) != uVar5);
  }
  if (values != (double *)0x0) {
    begin._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_start;
    end._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (reverse) {
      if (begin._M_current != end._M_current) {
        uVar5 = (long)end._M_current - (long)begin._M_current >> 2;
        iVar3 = 0;
        if (1 < uVar5) {
          iVar3 = 0;
          do {
            uVar5 = (long)uVar5 >> 1;
            iVar3 = iVar3 + 1;
          } while (1 < uVar5);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__0,false>
                  (begin,end,(anon_class_8_1_70098e60)&local_30,iVar3,true);
      }
    }
    else if (begin._M_current != end._M_current) {
      uVar5 = (long)end._M_current - (long)begin._M_current >> 2;
      iVar3 = 0;
      if (1 < uVar5) {
        iVar3 = 0;
        do {
          uVar5 = (long)uVar5 >> 1;
          iVar3 = iVar3 + 1;
        } while (1 < uVar5);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ipx::Sortperm(int,double_const*,bool)::__1,false>
                (begin,end,(anon_class_8_1_70098e60)&local_30,iVar3,true);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Int> Sortperm(Int m, const double* values, bool reverse) {
    std::vector<Int> perm(m);
    for (Int i = 0; i < m; i++) perm[i] = i;
    if (!values) return perm;

    if (reverse)
        pdqsort(perm.begin(), perm.end(), [&](Int i, Int j) {
            return std::make_pair(values[i], i) > std::make_pair(values[j], j);
        });
    else
        pdqsort(perm.begin(), perm.end(), [&](Int i, Int j) {
            return std::make_pair(values[i], i) < std::make_pair(values[j], j);
        });

    return perm;
}